

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  reference this_00;
  const_pointer pvVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  istream *piVar8;
  int local_294;
  string local_290 [4];
  int line_count;
  string line;
  istream local_258 [8];
  ifstream input_file;
  basic_string_view<char,_std::char_traits<char>_> *file_name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  exception *x;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  program_options::parse(argc,argv);
  this = program_options::input_files();
  __end1 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(this);
  file_name = (basic_string_view<char,_std::char_traits<char>_> *)
              std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      (&__end1,(__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                *)&file_name);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return 0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              ::operator*(&__end1);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
    std::ifstream::ifstream(local_258,pvVar5,_S_in);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"dog: could not open input file \'");
      pbVar7 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar6,*this_00);
      std::operator<<((ostream *)pbVar7,"\'!\n");
      argv_local._4_4_ = 1;
      line.field_2._12_4_ = 1;
    }
    else {
      std::__cxx11::string::string(local_290);
      local_294 = 1;
      while( true ) {
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_290)
        ;
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
        if (!bVar1) break;
        bVar1 = program_options::show_line_numbers();
        if (bVar1) {
          _Var4 = std::setw(6);
          poVar6 = std::operator<<((ostream *)&std::cout,_Var4);
          _Var3 = std::setfill<char>(' ');
          poVar6 = std::operator<<(poVar6,_Var3._M_c);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_294);
          std::operator<<(poVar6,"  ");
          local_294 = local_294 + 1;
        }
        std::operator<<((ostream *)&std::cout,local_290);
        bVar1 = program_options::show_ends();
        if (bVar1) {
          std::operator<<((ostream *)&std::cout,'$');
        }
        std::operator<<((ostream *)&std::cout,'\n');
      }
      std::__cxx11::string::~string(local_290);
      line.field_2._12_4_ = 0;
    }
    std::ifstream::~ifstream(local_258);
    if (line.field_2._12_4_ != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[]) {
    try {
        program_options::parse(argc, argv);
    } catch (const std::exception &x) {
        std::cerr << x.what() << '\n';
        std::cerr << "usage: dog [-n|--number] [-E|--show-ends] <input_file> ...\n";
        return EXIT_FAILURE;
    }

    for (const auto &file_name : program_options::input_files()) {
        std::ifstream input_file(file_name.data(), std::ios::in);
        if (!input_file.is_open()) {
            std::cerr << "dog: could not open input file '" << file_name << "'!\n";
            return EXIT_FAILURE;
        }

        std::string line;
        int         line_count = 1;
        while (std::getline(input_file, line)) {
            if (program_options::show_line_numbers()) {
                std::cout << std::setw(6) << std::setfill(' ') << line_count++ << "  ";
            }

            std::cout << line;

            if (program_options::show_ends()) {
                std::cout << '$';
            }

            std::cout << '\n';
        }
    }

    return EXIT_SUCCESS;
}